

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesShaft.h
# Opt level: O2

void __thiscall chrono::ChVariablesShaft::ArchiveIN(ChVariablesShaft *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChVariablesShaft>(marchive);
  local_28._value = &this->m_inertia;
  local_28._name = "m_inertia";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  this->m_inv_inertia = 1.0 / this->m_inertia;
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive) override {
        // version number
        /*int version =*/ marchive.VersionRead<ChVariablesShaft>();
        // deserialize parent class
        ChVariables::ArchiveIN(marchive);
        // stream in all member data:
        marchive >> CHNVP(m_inertia);
        SetInertia(m_inertia);
    }